

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * __thiscall
RPCArg::ToStringObj_abi_cxx11_(string *__return_storage_ptr__,RPCArg *this,bool oneline)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pRVar2;
  string_view func;
  string_view func_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  NonFatalCheckError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char *__s;
  pointer this_01;
  long in_FS_OFFSET;
  string_view msg;
  string_view msg_00;
  string_view file;
  string_view file_00;
  string res;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_58,"\"");
  GetFirstName_abi_cxx11_(&local_78,this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  __s = "\": ";
  if (oneline) {
    __s = "\":";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_58,__s);
  switch(this->m_type) {
  case OBJ:
  case OBJ_NAMED_PARAMS:
  case OBJ_USER_KEYS:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func._M_str = "ToStringObj";
    func._M_len = 0xb;
    msg._M_str = "Unreachable code reached (non-fatal)";
    msg._M_len = 0x24;
    file._M_str = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
    file._M_len = 0x55;
    NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x4e0,func);
    goto LAB_00dbad2a;
  case ARR:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_58,"[");
    this_01 = (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar2 = (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_01 != pRVar2) {
      do {
        ToString_abi_cxx11_(&local_98,this_01,oneline);
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_98,",");
        local_78._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
        paVar4 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == paVar4) {
          local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          local_78._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        }
        local_78._M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        this_01 = this_01 + 1;
      } while (this_01 != pRVar2);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"...]");
    break;
  case STR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"str\"");
    break;
  case NUM:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"n");
    break;
  case BOOL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"bool");
    break;
  case AMOUNT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"amount");
    break;
  case STR_HEX:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"hex\"");
    break;
  case RANGE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"n or [n,n]");
    break;
  default:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func_00._M_str = "ToStringObj";
    func_00._M_len = 0xb;
    msg_00._M_str = "Unreachable code reached (non-fatal)";
    msg_00._M_len = 0x24;
    file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
    file_00._M_len = 0x55;
    NonFatalCheckError::NonFatalCheckError(this_00,msg_00,file_00,0x4e2,func_00);
LAB_00dbad2a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00dbae5b;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00dbae5b:
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::ToStringObj(const bool oneline) const
{
    std::string res;
    res += "\"";
    res += GetFirstName();
    if (oneline) {
        res += "\":";
    } else {
        res += "\": ";
    }
    switch (m_type) {
    case Type::STR:
        return res + "\"str\"";
    case Type::STR_HEX:
        return res + "\"hex\"";
    case Type::NUM:
        return res + "n";
    case Type::RANGE:
        return res + "n or [n,n]";
    case Type::AMOUNT:
        return res + "amount";
    case Type::BOOL:
        return res + "bool";
    case Type::ARR:
        res += "[";
        for (const auto& i : m_inner) {
            res += i.ToString(oneline) + ",";
        }
        return res + "...]";
    case Type::OBJ:
    case Type::OBJ_NAMED_PARAMS:
    case Type::OBJ_USER_KEYS:
        // Currently unused, so avoid writing dead code
        NONFATAL_UNREACHABLE();
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}